

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

void __thiscall FIX::Header::Header(Header *this)

{
  message_order mStack_28;
  
  mStack_28.m_groupOrder.m_buffer._0_4_ = 0;
  mStack_28._20_8_ = 0;
  mStack_28.m_mode = header;
  mStack_28.m_delim = 0;
  mStack_28.m_groupOrder.m_size._0_4_ = 0;
  mStack_28.m_groupOrder.m_size._4_4_ = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&mStack_28,8);
  shared_array<int>::~shared_array(&mStack_28.m_groupOrder);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001fd470;
  return;
}

Assistant:

Header()
      : FieldMap(message_order(message_order::header), REQUIRED_FIELDS) {}